

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify_to_core.cpp
# Opt level: O0

void __thiscall
skiwi::anon_unknown_26::simplify_to_core_visitor::_postvisit
          (simplify_to_core_visitor *this,Expression *e)

{
  bool bVar1;
  PrimitiveCall *p_00;
  Let *l_00;
  Let *l;
  PrimitiveCall *p;
  Expression *e_local;
  simplify_to_core_visitor *this_local;
  
  bVar1 = std::
          holds_alternative<skiwi::PrimitiveCall,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                    (e);
  if (bVar1) {
    p_00 = std::
           get<skiwi::PrimitiveCall,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                     (e);
    bVar1 = std::operator==(&p_00->primitive_name,"and");
    if (bVar1) {
      _convert_and(this,e,p_00);
      _revisit_expr(this,e);
    }
    else {
      bVar1 = std::operator==(&p_00->primitive_name,"or");
      if (bVar1) {
        _convert_or(this,e,p_00);
        _revisit_expr(this,e);
      }
      else {
        bVar1 = std::operator==(&p_00->primitive_name,"unless");
        if (bVar1) {
          _convert_unless(this,e,p_00);
          _revisit_expr(this,e);
        }
        else {
          bVar1 = std::operator==(&p_00->primitive_name,"when");
          if (bVar1) {
            _convert_when(this,e,p_00);
            _revisit_expr(this,e);
          }
          else {
            bVar1 = std::operator==(&p_00->primitive_name,"delay");
            if (bVar1) {
              _convert_delay(this,e,p_00);
              _revisit_expr(this,e);
            }
          }
        }
      }
    }
  }
  else {
    bVar1 = std::
            holds_alternative<skiwi::Let,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                      (e);
    if (bVar1) {
      l_00 = std::
             get<skiwi::Let,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                       (e);
      if (l_00->bt == bt_letrec) {
        _convert_letrec(this,l_00);
        _revisit_expr(this,e);
      }
      else if (l_00->bt == bt_let_star) {
        _convert_let_star(this,l_00);
        _revisit_expr(this,e);
      }
      else if ((l_00->named_let & 1U) != 0) {
        _convert_named_let(this,e,l_00);
        _revisit_expr(this,e);
      }
    }
    else {
      bVar1 = std::
              holds_alternative<skiwi::Cond,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                        (e);
      if (bVar1) {
        _convert_cond(this,e);
        _revisit_expr(this,e);
      }
      else {
        bVar1 = std::
                holds_alternative<skiwi::Case,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                          (e);
        if (bVar1) {
          _convert_case(this,e);
          _revisit_expr(this,e);
        }
        else {
          bVar1 = std::
                  holds_alternative<skiwi::Do,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                            (e);
          if (bVar1) {
            _convert_do(this,e);
            _revisit_expr(this,e);
          }
        }
      }
    }
  }
  return;
}

Assistant:

virtual void _postvisit(Expression& e)
      {
      if (std::holds_alternative<PrimitiveCall>(e))
        {
        PrimitiveCall& p = std::get<PrimitiveCall>(e);
        if (p.primitive_name == "and")
          {
          _convert_and(e, p);
          _revisit_expr(e);
          }
        else if (p.primitive_name == "or")
          {
          _convert_or(e, p);
          _revisit_expr(e);
          }
        else if (p.primitive_name == "unless")
          {
          _convert_unless(e, p);
          _revisit_expr(e);
          }
        else if (p.primitive_name == "when")
          {
          _convert_when(e, p);
          _revisit_expr(e);
          }
        else if (p.primitive_name == "delay")
          {
          _convert_delay(e, p);
          _revisit_expr(e);
          }
        }
      else if (std::holds_alternative<Let>(e))
        {
        Let& l = std::get<Let>(e);
        if (l.bt == bt_letrec)
          {
          _convert_letrec(l);
          _revisit_expr(e);
          }
        else if (l.bt == bt_let_star)
          {
          _convert_let_star(l);
          _revisit_expr(e);
          }
        else if (l.named_let)
          {
          _convert_named_let(e, l);
          _revisit_expr(e);
          }
        }
      else if (std::holds_alternative<Cond>(e))
        {
        _convert_cond(e);
        _revisit_expr(e);
        }
      else if (std::holds_alternative<Case>(e))
        {
        _convert_case(e);
        _revisit_expr(e);
        }
      else if (std::holds_alternative<Do>(e))
        {
        _convert_do(e);
        _revisit_expr(e);
        }
      }